

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

void __thiscall
PSVIWriterHandlers::writeEmpty(PSVIWriterHandlers *this,XMLCh *elementName,StringList *attrs)

{
  XMLFormatter *pXVar1;
  char16_t *pcVar2;
  uint uVar3;
  XMLSize_t getAt;
  
  pXVar1 = this->fFormatter;
  *(undefined4 *)pXVar1 = 0;
  pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,this->fIndentChars);
  pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,L'<');
  xercesc_4_0::XMLFormatter::operator<<(pXVar1,elementName);
  if ((attrs->super_BaseRefVectorOf<char16_t>).fCurCount != 0) {
    uVar3 = 2;
    getAt = 0;
    do {
      pXVar1 = this->fFormatter;
      *(undefined4 *)pXVar1 = 0;
      pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,L' ');
      pcVar2 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                         (&attrs->super_BaseRefVectorOf<char16_t>,getAt);
      pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,pcVar2);
      pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,L"=\"");
      *(undefined4 *)pXVar1 = 2;
      pcVar2 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                         (&attrs->super_BaseRefVectorOf<char16_t>,(ulong)(uVar3 - 1));
      pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,pcVar2);
      *(undefined4 *)pXVar1 = 0;
      xercesc_4_0::XMLFormatter::operator<<(pXVar1,L'\"');
      getAt = (XMLSize_t)uVar3;
      uVar3 = uVar3 + 2;
    } while (getAt < (attrs->super_BaseRefVectorOf<char16_t>).fCurCount);
  }
  pXVar1 = this->fFormatter;
  *(undefined4 *)pXVar1 = 0;
  xercesc_4_0::XMLFormatter::operator<<(pXVar1,L"/>\n");
  return;
}

Assistant:

void PSVIWriterHandlers::writeEmpty(const XMLCh* const elementName, const StringList* const attrs) {
	*fFormatter
		<< XMLFormatter::NoEscapes << fIndentChars << chOpenAngle << elementName ;
	for (unsigned int i=0; i < attrs->size(); i+=2 ) {
		*fFormatter
			<< XMLFormatter::NoEscapes << chSpace << attrs->elementAt(i) << gEqualsQuote
			<< XMLFormatter::AttrEscapes << attrs->elementAt(i+1)
			<< XMLFormatter::NoEscapes << chDoubleQuote ;
	}
	*fFormatter
		<< XMLFormatter::NoEscapes << gSlashAngleFeed ;
}